

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix4d * tinyusdz::transpose(matrix4d *__return_storage_ptr__,matrix4d *_m)

{
  V *pVVar1;
  double *pdVar2;
  mat<double,_4,_4> *m_00;
  mat<double,_4,_4> local_190;
  undefined1 local_110 [8];
  matrix44d tm;
  matrix44d m;
  matrix4d *_m_local;
  
  linalg::mat<double,_4,_4>::mat((mat<double,_4,_4> *)&tm.w.w);
  linalg::mat<double,_4,_4>::mat((mat<double,_4,_4> *)local_110);
  pVVar1 = linalg::mat<double,_4,_4>::operator[]((mat<double,_4,_4> *)&tm.w.w,0);
  pdVar2 = linalg::vec<double,_4>::operator[](pVVar1,0);
  memcpy(pdVar2,_m,0x80);
  linalg::transpose<double,4>(&local_190,(linalg *)&tm.w.w,m_00);
  memcpy(local_110,&local_190,0x80);
  value::matrix4d::matrix4d(__return_storage_ptr__);
  pVVar1 = linalg::mat<double,_4,_4>::operator[]((mat<double,_4,_4> *)local_110,0);
  pdVar2 = linalg::vec<double,_4>::operator[](pVVar1,0);
  memcpy(__return_storage_ptr__,pdVar2,0x80);
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d transpose(const value::matrix4d &_m) {
  matrix44d m;
  matrix44d tm;
  // memory layout is same
  memcpy(&m[0][0], _m.m, sizeof(double) * 4 * 4);
  tm = linalg::transpose(m);

  value::matrix4d dst;

  // memory layout is same
  memcpy(&dst.m[0][0], &tm[0][0], sizeof(double) * 4 * 4);

  return dst;
}